

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  byte bVar1;
  short sVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int cx;
  int cy;
  ushort uVar7;
  undefined8 ptr;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  int num_vertices;
  int iVar11;
  ulong uVar12;
  stbtt_vertex *vertices;
  ushort *puVar13;
  ushort *puVar14;
  size_t sVar15;
  stbtt_vertex *psVar16;
  int iVar17;
  ulong uVar18;
  short sVar19;
  int was_off;
  stbtt_int32 cx_00;
  stbtt_int32 sVar20;
  stbtt_int32 cy_00;
  stbtt_int32 sVar21;
  ulong uVar22;
  int sx;
  int sy;
  long lVar23;
  long lVar24;
  byte bVar25;
  short sVar26;
  byte bVar27;
  ushort uVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  float fVar32;
  float fVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  float fVar39;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar40;
  float fVar41;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  stbtt__csctx local_a8;
  stbtt__csctx count_ctx;
  
  if ((info->cff).size == 0) {
    puVar3 = info->data;
    uVar10 = stbtt__GetGlyfOffset(info,glyph_index);
    *pvertices = (stbtt_vertex *)0x0;
    uVar31 = 0;
    if (-1 < (int)uVar10) {
      uVar12 = (ulong)uVar10;
      uVar8 = *(ushort *)(puVar3 + uVar12) << 8 | *(ushort *)(puVar3 + uVar12) >> 8;
      if ((short)uVar8 < 1) {
        if (uVar8 == 0xffff) {
          vertices = (stbtt_vertex *)0x0;
          uVar31 = 0;
          puVar13 = (ushort *)(puVar3 + uVar12 + 10);
          do {
            count_ctx.bounds = 0;
            count_ctx.started = 0;
            bVar25 = *(byte *)((long)puVar13 + 1);
            puVar14 = puVar13 + 2;
            if ((bVar25 & 2) == 0) {
              fVar32 = 0.0;
              fVar35 = 0.0;
            }
            else if ((bVar25 & 1) == 0) {
              fVar32 = (float)(int)(char)*puVar14;
              fVar35 = (float)(int)((long)((ulong)*(byte *)((long)puVar13 + 5) << 0x38) >> 0x38);
              puVar14 = puVar13 + 3;
            }
            else {
              auVar5._9_7_ = 0;
              auVar5._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
              auVar4._10_6_ = 0;
              auVar4._0_10_ = SUB1610(auVar5 << 0x38,6);
              auVar38._11_5_ = 0;
              auVar38._0_11_ = SUB1611(auVar4 << 0x30,5);
              auVar6._1_12_ = SUB1612(auVar38 << 0x28,4);
              auVar6[0] = (char)puVar13[3];
              auVar6._13_3_ = 0;
              auVar34._1_14_ = SUB1614(auVar6 << 0x18,2);
              auVar34[0] = (char)*puVar14;
              auVar34[0xf] = 0;
              auVar34 = ZEXT416((uint)*(byte *)((long)puVar13 + 7) << 0x10 |
                                (uint)*(byte *)((long)puVar13 + 5)) | auVar34 << 8;
              fVar32 = (float)(int)auVar34._0_2_;
              fVar35 = (float)(int)auVar34._2_2_;
              puVar14 = puVar13 + 4;
            }
            if ((bVar25 & 8) == 0) {
              if ((bVar25 & 0x40) != 0) {
                uVar8 = *puVar14;
                fVar39 = (float)(int)(short)(puVar14[1] << 8 | puVar14[1] >> 8) * 6.1035156e-05;
                puVar14 = puVar14 + 2;
                _local_f8 = ZEXT416((uint)((float)(int)(short)(uVar8 << 8 | uVar8 >> 8) *
                                          6.1035156e-05));
                goto LAB_0017ef28;
              }
              if ((char)bVar25 < '\0') {
                local_f8._0_4_ =
                     (float)(int)CONCAT11((char)*puVar14,*(char *)((long)puVar14 + 1)) *
                     6.1035156e-05;
                local_f8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)puVar14[2],
                                                         *(char *)((long)puVar14 + 5)) << 0x30) >>
                                 0x30) * 6.1035156e-05;
                register0x00001288 = 0;
                local_c8._0_4_ =
                     (float)(int)CONCAT11((char)puVar14[1],*(char *)((long)puVar14 + 3)) *
                     6.1035156e-05;
                local_c8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)puVar14[3],
                                                         *(char *)((long)puVar14 + 7)) << 0x30) >>
                                 0x30) * 6.1035156e-05;
                register0x00001248 = 0;
                puVar14 = puVar14 + 4;
              }
              else {
                _local_f8 = ZEXT812(0x3f800000);
                fStack_ec = 0.0;
                _local_c8 = ZEXT816(0x3f80000000000000);
              }
            }
            else {
              fVar39 = (float)(int)(short)(*puVar14 << 8 | *puVar14 >> 8) * 6.1035156e-05;
              puVar14 = puVar14 + 1;
              register0x00001244 = SUB1612((undefined1  [16])0x0,4);
              local_f8._0_4_ = fVar39;
LAB_0017ef28:
              _local_c8 = ZEXT416((uint)fVar39) << 0x20;
            }
            uVar10 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar13[1] << 8 | puVar13[1] >> 8),
                                         (stbtt_vertex **)&count_ctx);
            ptr = count_ctx._0_8_;
            if (0 < (int)uVar10) {
              auVar33._0_4_ = (float)local_c8._0_4_ * (float)local_c8._0_4_;
              auVar33._4_4_ = (float)local_c8._4_4_ * (float)local_c8._4_4_;
              auVar33._8_4_ = fStack_c0 * fStack_c0;
              auVar33._12_4_ = fStack_bc * fStack_bc;
              auVar36._0_4_ = (float)local_f8._0_4_ * (float)local_f8._0_4_ + auVar33._0_4_;
              auVar36._4_4_ = (float)local_f8._4_4_ * (float)local_f8._4_4_ + auVar33._4_4_;
              auVar36._8_4_ = fStack_f0 * fStack_f0 + auVar33._8_4_;
              auVar36._12_4_ = fStack_ec * fStack_ec + auVar33._12_4_;
              auVar34 = sqrtps(auVar33,auVar36);
              sVar15 = 0;
              do {
                fVar39 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 4 + sVar15) <<
                                            0x30) >> 0x30);
                fVar40 = (float)(int)*(short *)(count_ctx._0_8_ + 2 + sVar15);
                fVar41 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 6 + sVar15) <<
                                            0x30) >> 0x30);
                auVar37._0_4_ =
                     (int)((fVar40 * (float)local_f8._4_4_ +
                            (float)(int)*(short *)(count_ctx._0_8_ + sVar15) * (float)local_f8._0_4_
                           + fVar32) * auVar34._0_4_);
                auVar37._4_4_ =
                     (int)((fVar40 * (float)local_c8._4_4_ +
                            (float)(int)*(short *)(count_ctx._0_8_ + sVar15) * (float)local_c8._0_4_
                           + fVar35) * auVar34._4_4_);
                auVar37._8_4_ =
                     (int)((fVar41 * (float)local_f8._4_4_ + fVar39 * (float)local_f8._0_4_ + fVar32
                           ) * auVar34._0_4_);
                auVar37._12_4_ =
                     (int)((fVar41 * (float)local_c8._4_4_ + fVar39 * (float)local_c8._0_4_ + fVar35
                           ) * auVar34._4_4_);
                auVar38 = packssdw(auVar37,auVar37);
                *(long *)(count_ctx._0_8_ + sVar15) = auVar38._0_8_;
                sVar15 = sVar15 + 0xe;
              } while ((ulong)uVar10 * 0xe != sVar15);
              psVar16 = (stbtt_vertex *)ImGui::MemAlloc((ulong)(uVar10 + uVar31) * 0xe);
              if (psVar16 == (stbtt_vertex *)0x0) {
                if (vertices != (stbtt_vertex *)0x0) {
                  ImGui::MemFree(vertices);
                }
                ImGui::MemFree((void *)ptr);
                return 0;
              }
              if (0 < (int)uVar31) {
                memcpy(psVar16,vertices,(ulong)uVar31 * 0xe);
              }
              memcpy(psVar16 + uVar31,(void *)ptr,(ulong)uVar10 * 0xe);
              if (vertices != (stbtt_vertex *)0x0) {
                ImGui::MemFree(vertices);
              }
              ImGui::MemFree((void *)ptr);
              vertices = psVar16;
              uVar31 = uVar10 + uVar31;
            }
            puVar13 = puVar14;
          } while ((bVar25 & 0x20) != 0);
        }
        else {
          uVar31 = 0;
          vertices = (stbtt_vertex *)0x0;
        }
      }
      else {
        uVar18 = (ulong)((uint)uVar8 + (uint)uVar8);
        bVar25 = puVar3[uVar18 + uVar12 + 10];
        bVar27 = puVar3[uVar18 + uVar12 + 0xb];
        bVar1 = puVar3[uVar18 + uVar12 + 9];
        iVar9 = (uint)puVar3[uVar18 + uVar12 + 8] * 0x100;
        vertices = (stbtt_vertex *)
                   ImGui::MemAlloc((ulong)(((uint)bVar1 + iVar9 + (uint)uVar8 * 2) * 0xe + 0xe));
        if (vertices == (stbtt_vertex *)0x0) {
          return 0;
        }
        puVar13 = (ushort *)(puVar3 + (ulong)bVar25 * 0x100 + (ulong)bVar27 + uVar18 + uVar12 + 0xc)
        ;
        uVar18 = uVar18 & 0xffff;
        iVar29 = (int)uVar18;
        uVar22 = (ulong)(iVar9 + (uint)bVar1);
        lVar23 = 0;
        bVar25 = 0;
        bVar27 = 0;
        do {
          if (bVar27 == 0) {
            bVar25 = (byte)*puVar13;
            if ((bVar25 & 8) == 0) {
              puVar13 = (ushort *)((long)puVar13 + 1);
              bVar27 = 0;
            }
            else {
              bVar27 = *(byte *)((long)puVar13 + 1);
              puVar13 = puVar13 + 1;
            }
          }
          else {
            bVar27 = bVar27 - 1;
          }
          *(byte *)((long)vertices + lVar23 + (ulong)(uint)(iVar29 << 4) + uVar18 * -2 + 0xc) =
               bVar25;
          lVar23 = lVar23 + 0xe;
        } while ((ulong)(((uint)bVar1 + iVar9 + 1) * 0x10) - (uVar22 * 2 + 2) != lVar23);
        lVar23 = (ulong)(uint)(iVar29 << 4) + uVar18 * -2;
        lVar24 = 0;
        sVar26 = 0;
        do {
          bVar25 = *(byte *)((long)vertices + lVar24 + lVar23 + 0xc);
          if ((bVar25 & 2) == 0) {
            if ((bVar25 & 0x10) == 0) {
              sVar26 = sVar26 + (*puVar13 << 8 | *puVar13 >> 8);
              puVar13 = puVar13 + 1;
            }
          }
          else {
            uVar7 = *puVar13;
            puVar13 = (ushort *)((long)puVar13 + 1);
            uVar28 = -(ushort)(byte)uVar7;
            if ((bVar25 & 0x10) != 0) {
              uVar28 = (ushort)(byte)uVar7;
            }
            sVar26 = sVar26 + uVar28;
          }
          *(short *)((long)vertices + lVar24 + lVar23) = sVar26;
          lVar24 = lVar24 + 0xe;
        } while ((ulong)((iVar9 + (uint)bVar1 + 1) * 0x10) - (uVar22 * 2 + 2) != lVar24);
        lVar23 = (ulong)(uint)(iVar29 << 4) + uVar18 * -2;
        lVar24 = 0;
        sVar26 = 0;
        do {
          bVar25 = *(byte *)((long)vertices + lVar24 + lVar23 + 0xc);
          if ((bVar25 & 4) == 0) {
            if ((bVar25 & 0x20) == 0) {
              sVar26 = sVar26 + (*puVar13 << 8 | *puVar13 >> 8);
              puVar13 = puVar13 + 1;
            }
          }
          else {
            uVar7 = *puVar13;
            puVar13 = (ushort *)((long)puVar13 + 1);
            uVar28 = -(ushort)(byte)uVar7;
            if ((bVar25 & 0x20) != 0) {
              uVar28 = (ushort)(byte)uVar7;
            }
            sVar26 = sVar26 + uVar28;
          }
          *(short *)((long)vertices + lVar24 + lVar23 + 2) = sVar26;
          lVar24 = lVar24 + 0xe;
        } while ((ulong)((iVar9 + (uint)bVar1 + 1) * 0x10) - (uVar22 * 2 + 2) != lVar24);
        num_vertices = 0;
        iVar29 = 0;
        iVar17 = 0;
        iVar11 = 0;
        sVar21 = 0;
        sVar20 = 0;
        sy = 0;
        sx = 0;
        uVar31 = 0;
        was_off = 0;
        cx = 0;
        cy = 0;
        do {
          lVar23 = (long)(int)((uint)uVar8 + (uint)uVar8 + iVar29);
          bVar25 = vertices[lVar23].type;
          sVar26 = vertices[lVar23].x;
          sVar2 = vertices[lVar23].y;
          cx_00 = (stbtt_int32)sVar26;
          cy_00 = (stbtt_int32)sVar2;
          if (iVar11 == iVar29) {
            if (iVar29 != 0) {
              num_vertices = stbtt__close_shape(vertices,num_vertices,was_off,uVar31,sx,sy,sVar20,
                                                sVar21,cx,cy);
            }
            sx = cx_00;
            sy = cy_00;
            if ((bVar25 & 1) == 0) {
              sVar20 = cx_00;
              sVar21 = cy_00;
              if ((vertices[lVar23 + 1].type & 1) == 0) {
                sx = vertices[lVar23 + 1].x + cx_00 >> 1;
                sy = vertices[lVar23 + 1].y + cy_00 >> 1;
              }
              else {
                iVar29 = iVar29 + 1;
                sx = (int)vertices[lVar23 + 1].x;
                sy = (int)vertices[lVar23 + 1].y;
              }
            }
            uVar31 = bVar25 & 1 ^ 1;
            vertices[num_vertices].type = '\x01';
            vertices[num_vertices].x = (short)sx;
            vertices[num_vertices].y = (short)sy;
            vertices[num_vertices].cx = 0;
            vertices[num_vertices].cy = 0;
            iVar11 = (ushort)(*(ushort *)(puVar3 + (long)iVar17 * 2 + uVar12 + 10) << 8 |
                             *(ushort *)(puVar3 + (long)iVar17 * 2 + uVar12 + 10) >> 8) + 1;
            iVar17 = iVar17 + 1;
            was_off = 0;
            iVar30 = iVar29;
            num_vertices = num_vertices + 1;
            cx_00 = cx;
            cy_00 = cy;
          }
          else {
            sVar19 = (short)cy;
            iVar30 = iVar29;
            if ((bVar25 & 1) == 0) {
              iVar29 = num_vertices;
              if (was_off != 0) {
                iVar29 = num_vertices + 1;
                vertices[num_vertices].type = '\x03';
                vertices[num_vertices].x = (short)((uint)(cx + cx_00) >> 1);
                vertices[num_vertices].y = (short)((uint)(cy + cy_00) >> 1);
                vertices[num_vertices].cx = (short)cx;
                vertices[num_vertices].cy = sVar19;
              }
              was_off = 1;
              num_vertices = iVar29;
            }
            else {
              psVar16 = vertices + num_vertices;
              if (was_off == 0) {
                psVar16->type = '\x02';
                psVar16->x = sVar26;
                psVar16->y = sVar2;
                psVar16->cx = 0;
                sVar19 = 0;
              }
              else {
                psVar16->type = '\x03';
                psVar16->x = sVar26;
                psVar16->y = sVar2;
                psVar16->cx = (short)cx;
              }
              psVar16->cy = sVar19;
              was_off = 0;
              num_vertices = num_vertices + 1;
              cx_00 = cx;
              cy_00 = cy;
            }
          }
          iVar29 = iVar30 + 1;
          cx = cx_00;
          cy = cy_00;
        } while (iVar30 < (int)((uint)bVar1 + iVar9));
        uVar31 = stbtt__close_shape(vertices,num_vertices,was_off,uVar31,sx,sy,sVar20,sVar21,cx_00,
                                    cy_00);
      }
      *pvertices = vertices;
    }
  }
  else {
    count_ctx.first_x = 0.0;
    count_ctx.first_y = 0.0;
    count_ctx.min_y = 0;
    count_ctx.max_y = 0;
    count_ctx.pvertices = (stbtt_vertex *)0x0;
    count_ctx.x = 0.0;
    count_ctx.y = 0.0;
    count_ctx.min_x = 0;
    count_ctx.max_x = 0;
    uVar31 = 0;
    count_ctx.num_vertices = 0;
    count_ctx._52_4_ = 0;
    count_ctx.bounds = 1;
    count_ctx.started = 0;
    local_a8.num_vertices = 0;
    local_a8._52_4_ = 0;
    local_a8.min_y = 0;
    local_a8.max_y = 0;
    local_a8.pvertices = (stbtt_vertex *)0x0;
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    local_a8.min_x = 0;
    local_a8.max_x = 0;
    local_a8.bounds = 0;
    local_a8.started = 0;
    local_a8.first_x = 0.0;
    local_a8.first_y = 0.0;
    iVar9 = stbtt__run_charstring(info,glyph_index,&count_ctx);
    if (iVar9 != 0) {
      local_a8.pvertices = (stbtt_vertex *)ImGui::MemAlloc((long)count_ctx.num_vertices * 0xe);
      *pvertices = local_a8.pvertices;
      iVar9 = stbtt__run_charstring(info,glyph_index,&local_a8);
      if (iVar9 != 0) {
        return local_a8.num_vertices;
      }
    }
    *pvertices = (stbtt_vertex *)0x0;
  }
  return uVar31;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   if (!info->cff.size)
      return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
   else
      return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}